

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimationNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  size_t sVar2;
  runtime_error *this_00;
  long *in_RDX;
  Node *in_RDI;
  Ref<embree::SceneGraph::Node> nodei;
  size_t i;
  Ref<embree::SceneGraph::Node> *node;
  Ref<embree::SceneGraph::Node> *in_stack_000001b8;
  Ref<embree::SceneGraph::Node> *in_stack_00000450;
  Ref<embree::SceneGraph::Node> *in_stack_00000458;
  Ref<embree::XML> *in_stack_00001718;
  XMLLoader *in_stack_00001720;
  char *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  ParseLocation *in_stack_fffffffffffffec8;
  _func_int **pp_Var3;
  long *local_130;
  _func_int **local_128;
  long *local_120;
  ulong local_118;
  undefined1 local_10e;
  undefined1 local_10d;
  string local_e0 [32];
  long *local_c0;
  long *local_a8;
  long *local_a0;
  long *local_98;
  long *local_90;
  _func_int ***local_78;
  long **local_70;
  long **local_68;
  undefined1 *local_58;
  long **local_50;
  _func_int ***local_40;
  long **local_30;
  undefined1 *local_20;
  
  local_c0 = in_RDX;
  sVar2 = XML::size((XML *)0x3bf742);
  if (sVar2 != 0) {
    local_10e = 0;
    local_98 = local_c0;
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (*local_c0 + 0x80),0);
    loadNode(in_stack_00001720,in_stack_00001718);
    local_118 = 1;
    while( true ) {
      uVar1 = local_118;
      local_a0 = local_c0;
      sVar2 = XML::size((XML *)0x3bf90d);
      if (sVar2 <= uVar1) break;
      local_a8 = local_c0;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (*local_c0 + 0x80),local_118);
      loadNode(in_stack_00001720,in_stack_00001718);
      local_78 = &local_128;
      local_128 = (in_RDI->super_RefCount)._vptr_RefCount;
      if (local_128 != (_func_int **)0x0) {
        (**(code **)(*local_128 + 0x10))();
      }
      local_68 = &local_130;
      local_70 = &local_120;
      local_130 = local_120;
      if (local_120 != (long *)0x0) {
        (**(code **)(*local_120 + 0x10))();
      }
      SceneGraph::extend_animation(in_stack_00000458,in_stack_00000450);
      local_50 = &local_130;
      if (local_130 != (long *)0x0) {
        (**(code **)(*local_130 + 0x18))();
      }
      local_40 = &local_128;
      if (local_128 != (_func_int **)0x0) {
        (**(code **)(*local_128 + 0x18))();
      }
      local_30 = &local_120;
      if (local_120 != (long *)0x0) {
        (**(code **)(*local_120 + 0x18))();
      }
      local_118 = local_118 + 1;
    }
    local_58 = &stack0xfffffffffffffec8;
    pp_Var3 = (in_RDI->super_RefCount)._vptr_RefCount;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 0x10))();
    }
    SceneGraph::optimize_animation(in_stack_000001b8);
    local_20 = &stack0xfffffffffffffec8;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 0x18))();
    }
    return (Ref<embree::SceneGraph::Node>)in_RDI;
  }
  local_10d = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90 = local_c0;
  ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffec8);
  std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::runtime_error::runtime_error(this_00,local_e0);
  local_10d = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimationNode(const Ref<XML>& xml) 
  {
    if (xml->size() == 0) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Animation node");
    Ref<SceneGraph::Node> node = loadNode(xml->children[0]);
    for (size_t i=1; i<xml->size(); i++) {
      Ref<SceneGraph::Node> nodei = loadNode(xml->children[i]);
      SceneGraph::extend_animation(node,nodei);
    }
    SceneGraph::optimize_animation(node);
    return node;
  }